

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcProductRepresentation::~IfcProductRepresentation
          (IfcProductRepresentation *this)

{
  _func_int *p_Var1;
  void *pvVar2;
  
  p_Var1 = (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>).
           _vptr_ObjectHelper[-3];
  *(undefined ***)
   ((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>).
           _vptr_ObjectHelper + (long)p_Var1) = &PTR__IfcProductRepresentation_0080f508;
  *(undefined ***)(&this->field_0x78 + (long)p_Var1) = &PTR__IfcProductRepresentation_0080f530;
  if (*(void **)(p_Var1 + (long)&(this->Representations).
                                 super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                                 .
                                 super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                ) != (void *)0x0) {
    operator_delete(*(void **)(p_Var1 + (long)&(this->Representations).
                                               super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                                               .
                                               super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                              ));
  }
  if (*(code **)(p_Var1 + (long)&(this->Description).ptr._M_dataplus) !=
      p_Var1 + 0x10 + (long)&(this->Description).ptr._M_dataplus) {
    operator_delete(*(code **)(p_Var1 + (long)&(this->Description).ptr._M_dataplus));
  }
  pvVar2 = *(void **)(&(this->
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>).
                       field_0x10 + (long)p_Var1);
  if ((undefined1 *)pvVar2 !=
      &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>).field_0x20
      + (long)p_Var1) {
    operator_delete(pvVar2);
    return;
  }
  return;
}

Assistant:

IfcProductRepresentation() : Object("IfcProductRepresentation") {}